

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

size_type __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
::erase<std::__cxx11::string>
          (raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           *this,key_arg<std::__cxx11::basic_string<char>_> *key)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  bool bVar3;
  iterator it;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_11;
  
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()(&local_11,key);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar2;
  it = find<std::__cxx11::string>
                 (this,key,SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
                           SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0));
  bVar3 = it.ctrl_ != (ctrl_t *)(*(long *)this + *(long *)(this + 0x18));
  if (bVar3) {
    raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_erase((raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this,it);
  }
  return (ulong)bVar3;
}

Assistant:

size_type erase(const key_arg<K>& key) {
        auto it = find(key);
        if (it == end()) return 0;
        _erase(it);
        return 1;
    }